

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O0

void test_inclusion_mbs(void)

{
  wchar_t wVar1;
  char *local_20;
  char *mp;
  archive *m;
  archive_entry *ae;
  
  mp = (char *)archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'å',(uint)((archive *)mp != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    m = (archive *)archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'ç',(uint)((archive_entry *)m != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      archive_match_free((archive *)mp);
    }
    else {
      wVar1 = archive_match_include_pattern((archive *)mp,"^aa*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'í',0,"0",(long)wVar1,"archive_match_include_pattern(m, \"^aa*\")",mp);
      archive_entry_copy_pathname((archive_entry *)m,"aa1234");
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ò',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ó',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear((archive_entry *)m);
      archive_entry_copy_pathname_w((archive_entry *)m,anon_var_dwarf_82a9 + 1);
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'÷',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ø',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname((archive_entry *)m,"a1234");
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ý',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'þ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear((archive_entry *)m);
      archive_entry_copy_pathname_w((archive_entry *)m,anon_var_dwarf_82a9 + 2);
      failure("\'a1234\' should be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ă',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ă',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions((archive *)mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ć',0,"0",(long)wVar1,"archive_match_path_unmatched_inclusions(m)",
                          (void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next((archive *)mp,&local_20);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ĉ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",mp);
      archive_entry_free((archive_entry *)m);
      archive_match_free((archive *)mp);
    }
  }
  return;
}

Assistant:

static void
test_inclusion_mbs(void)
{
	struct archive_entry *ae;
	struct archive *m;
	const char *mp;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	/* Test for pattern "^aa*" */
	assertEqualIntA(m, 0, archive_match_include_pattern(m, "^aa*"));

	/* Test with 'aa1234', which should not be excluded. */
	archive_entry_copy_pathname(ae, "aa1234");
	failure("'aa1234' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"aa1234");
	failure("'aa1234' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	/* Test with 'a1234', which should be excluded. */
	archive_entry_copy_pathname(ae, "a1234");
	failure("'a1234' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"a1234");
	failure("'a1234' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Verify unmatched_inclusions. */
	assertEqualInt(0, archive_match_path_unmatched_inclusions(m));
	assertEqualIntA(m, ARCHIVE_EOF,
	    archive_match_path_unmatched_inclusions_next(m, &mp));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}